

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

int __thiscall QDateTimeEditPrivate::init(QDateTimeEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  undefined4 uVar1;
  int iVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QDate local_70;
  QString local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
  QDate::QDate((QDate *)&local_48.shared,2000,1,1);
  uVar1 = QDate::year();
  *(undefined4 *)&this->field_0x3e4 = uVar1;
  iVar2 = ::QVariant::typeId((QVariant *)ctx);
  if (iVar2 == 0x10) {
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,(QVariant *)ctx);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultDateTimeFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003e2ef6;
    psVar3 = (storage_type *)0x13;
  }
  else if (iVar2 == 0xf) {
    QDate::QDate(&local_70,2000,1,1);
    uVar1 = ::QVariant::toTime();
    QDateTime::QDateTime((QDateTime *)&local_68,local_70.jd,uVar1,&this->timeZone,1);
    ::QVariant::QVariant((QVariant *)&local_48,(QDateTime *)&local_68);
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,(QVariant *)&local_48);
    ::QVariant::~QVariant((QVariant *)&local_48);
    QDateTime::~QDateTime((QDateTime *)&local_68);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultTimeFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003e2ef6;
    psVar3 = (storage_type *)0x8;
  }
  else {
    if (iVar2 != 0xe) goto LAB_003e2ef6;
    local_50 = ::QVariant::toDate();
    QDate::startOfDay((QTimeZone *)&local_68);
    ::QVariant::QVariant((QVariant *)&local_48,(QDateTime *)&local_68);
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,(QVariant *)&local_48);
    ::QVariant::~QVariant((QVariant *)&local_48);
    QDateTime::~QDateTime((QDateTime *)&local_68);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultDateFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003e2ef6;
    psVar3 = &DAT_0000000a;
  }
  QVar4.m_data = psVar3;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar4);
  local_68.d.d = (Data *)local_48.shared;
  local_68.d.ptr = (char16_t *)local_48._8_8_;
  local_68.d.size = local_48._16_8_;
  QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_003e2ef6:
  QWidget::setInputMethodHints(this_00,(InputMethodHints)0x8);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_DateTimeEditLayoutItem,(QStyleOption *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::init(const QVariant &var)
{
    Q_Q(QDateTimeEdit);
    defaultCenturyStart = QDATETIMEEDIT_DATE_INITIAL.year();
    switch (var.userType()) {
    case QMetaType::QDate:
        value = var.toDate().startOfDay(timeZone);
        updateTimeZone();
        q->setDisplayFormat(defaultDateFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy"_L1);
        break;
    case QMetaType::QDateTime:
        value = var;
        updateTimeZone();
        q->setDisplayFormat(defaultDateTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy hh:mm:ss"_L1);
        break;
    case QMetaType::QTime:
        value = dateTimeValue(QDATETIMEEDIT_DATE_INITIAL, var.toTime());
        updateTimeZone();
        q->setDisplayFormat(defaultTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("hh:mm:ss"_L1);
        break;
    default:
        Q_ASSERT_X(0, "QDateTimeEditPrivate::init", "Internal error");
        break;
    }
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setCalendarPopup(true);
#endif
    q->setInputMethodHints(Qt::ImhPreferNumbers);
    setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
}